

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O2

Frame * __thiscall Frame::limit(Frame *this,size_t newSize)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  
  if (this->m_Size < newSize) {
    newSize = this->m_Size;
  }
  _Var1._M_head_impl =
       (this->m_Data)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  this->m_Size = newSize;
  this->m_Pos = _Var1._M_head_impl;
  return this;
}

Assistant:

Frame& Frame::limit(size_t newSize)
{
    m_Size = std::min(m_Size, newSize);
    m_Pos = m_Data.get();
    return *this;
}